

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

int __thiscall ON_PolyCurve::CloseGaps(ON_PolyCurve *this)

{
  bool bVar1;
  int gap_index_00;
  int iVar2;
  int local_18;
  int gap_index;
  int segment_index0;
  int rc;
  ON_PolyCurve *this_local;
  
  gap_index = 0;
  local_18 = 0;
  while ((gap_index_00 = FindNextGap(this,local_18), local_18 < gap_index_00 &&
         (iVar2 = ON_SimpleArray<ON_Curve_*>::Count
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>),
         gap_index_00 < iVar2))) {
    bVar1 = CloseGap(this,gap_index_00,0);
    local_18 = gap_index_00;
    if (bVar1) {
      gap_index = gap_index + 1;
    }
  }
  return gap_index;
}

Assistant:

int ON_PolyCurve::CloseGaps()
{
  int rc = 0;
  int segment_index0 = 0;
  int gap_index = 0;
  
  for(;;)
  {
    gap_index = FindNextGap(segment_index0);
    if ( gap_index <= segment_index0 || gap_index >= m_segment.Count() )
      break;
    if ( CloseGap(gap_index,0) )
      rc++;
    segment_index0 = gap_index;
  }

  return rc;
}